

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

QPolygonF * __thiscall
QGraphicsItem::mapFromParent
          (QPolygonF *__return_storage_ptr__,QGraphicsItem *this,QPolygonF *polygon)

{
  QGraphicsItemPrivate *this_00;
  long lVar1;
  undefined8 *puVar2;
  QTransform *pQVar3;
  long in_FS_OFFSET;
  QTransform matrix;
  QTransform QStack_c8;
  undefined4 local_78;
  uint uStack_74;
  undefined4 uStack_70;
  uint uStack_6c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d_ptr).d;
  if (this_00->transformData == (TransformData *)0x0) {
    local_78 = *(undefined4 *)&(this_00->pos).xp;
    uStack_70 = *(undefined4 *)&(this_00->pos).yp;
    uStack_74 = *(uint *)((long)&(this_00->pos).xp + 4) ^ 0x80000000;
    uStack_6c = *(uint *)((long)&(this_00->pos).yp + 4) ^ 0x80000000;
    QPolygonF::translated((QPointF *)__return_storage_ptr__);
  }
  else {
    puVar2 = &DAT_006f1ed0;
    pQVar3 = &QStack_c8;
    for (lVar1 = 10; lVar1 != 0; lVar1 = lVar1 + -1) {
      *(undefined8 *)pQVar3 = *puVar2;
      puVar2 = puVar2 + 1;
      pQVar3 = (QTransform *)((long)pQVar3 + 8);
    }
    puVar2 = &DAT_006f1e88;
    pQVar3 = &QStack_c8;
    for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
      *(undefined8 *)pQVar3 = *puVar2;
      puVar2 = puVar2 + 1;
      pQVar3 = (QTransform *)((long)pQVar3 + 8);
    }
    QStack_c8._72_2_ = 0xa800;
    QGraphicsItemPrivate::combineTransformToParent(this_00,&QStack_c8,(QTransform *)0x0);
    QTransform::inverted((bool *)&local_78);
    QTransform::map(__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QPolygonF QGraphicsItem::mapFromParent(const QPolygonF &polygon) const
{
    // COMBINE
    if (!d_ptr->transformData)
        return polygon.translated(-d_ptr->pos);
    return d_ptr->transformToParent().inverted().map(polygon);
}